

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O3

void vkt::FragmentOperations::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,int numViewports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_t sVar4;
  ProgramSources *pPVar5;
  ostringstream src;
  undefined1 auStack_218 [8];
  long *local_210;
  long local_208;
  long local_200 [2];
  string local_1f0;
  uint local_1d0;
  value_type local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color = in_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"vert","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 0;
  paVar2 = &local_1c8.field_2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(points) in;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(triangle_strip, max_vertices=4) out;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    vec4 gl_Position;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color[];\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position      = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color        = in_color[0];\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    EmitVertex();",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position      = vec4(-1.0, 1.0, 0.0, 1.0);\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color        = in_color[0];\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    EmitVertex();",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position      = vec4(1.0, -1.0, 0.0, 1.0);\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color        = in_color[0];\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    EmitVertex();",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_ViewportIndex = gl_PrimitiveIDIn;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position      = vec4(1.0, 1.0, 0.0, 1.0);\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color        = in_color[0];\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    EmitVertex();",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"geom","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 2;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    out_color = in_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"frag","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0 = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_210,local_208 + (long)local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_1d0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const int numViewports)
{
	DE_UNREF(numViewports);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    out_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Geometry shader
	{
		// Each input point generates a fullscreen quad.

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(points) in;\n"
			<< "layout(triangle_strip, max_vertices=4) out;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color[];\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(-1.0, -1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(-1.0, 1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(1.0, -1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "\n"
			<< "    gl_ViewportIndex = gl_PrimitiveIDIn;\n"
			<< "    gl_Position      = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "    out_color        = in_color[0];\n"
			<< "    EmitVertex();"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    out_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}